

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeChangeP4(Vdbe *p,int addr,char *zP4,int n)

{
  Op *pOVar1;
  size_t sVar2;
  void *__dest;
  ulong __n;
  
  if (p->db->mallocFailed != '\0') {
    if (n == -0xb) {
      return;
    }
    freeP4(p->db,n,zP4);
    return;
  }
  if (addr < 0) {
    addr = p->nOp + -1;
  }
  pOVar1 = p->aOp;
  if ((n < 0) && (pOVar1[addr].p4type == '\0')) {
    if (n == -3) {
      pOVar1[addr].p4.i = (int)zP4;
      pOVar1[addr].p4type = -3;
      return;
    }
    if (zP4 == (char *)0x0) {
      return;
    }
    pOVar1[addr].p4.z = zP4;
    pOVar1[addr].p4type = (char)n;
    if (n != -0xb) {
      return;
    }
    *(int *)(zP4 + 0x18) = *(int *)(zP4 + 0x18) + 1;
    return;
  }
  __n = (ulong)(uint)n;
  if (pOVar1[addr].p4type != '\0') {
    freeP4(p->db,(int)pOVar1[addr].p4type,pOVar1[addr].p4.p);
    pOVar1[addr].p4type = '\0';
    pOVar1[addr].p4.p = (void *)0x0;
  }
  if (n < 0) {
    sqlite3VdbeChangeP4(p,(int)((ulong)((long)pOVar1 + ((long)addr * 0x18 - (long)p->aOp)) >> 3) *
                          -0x55555555,zP4,n);
    return;
  }
  if (n == 0) {
    if (zP4 != (char *)0x0) {
      sVar2 = strlen(zP4);
      __n = (ulong)((uint)sVar2 & 0x3fffffff);
      goto LAB_0014f106;
    }
  }
  else if (zP4 != (char *)0x0) {
LAB_0014f106:
    __dest = sqlite3DbMallocRawNN(p->db,__n + 1);
    if (__dest != (void *)0x0) {
      memcpy(__dest,zP4,__n);
      *(undefined1 *)((long)__dest + __n) = 0;
      goto LAB_0014f133;
    }
  }
  __dest = (void *)0x0;
LAB_0014f133:
  pOVar1[addr].p4.p = __dest;
  pOVar1[addr].p4type = -6;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeP4(Vdbe *p, int addr, const char *zP4, int n){
  Op *pOp;
  sqlite3 *db;
  assert( p!=0 );
  db = p->db;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( p->aOp!=0 || db->mallocFailed );
  if( db->mallocFailed ){
    if( n!=P4_VTAB ) freeP4(db, n, (void*)*(char**)&zP4);
    return;
  }
  assert( p->nOp>0 );
  assert( addr<p->nOp );
  if( addr<0 ){
    addr = p->nOp - 1;
  }
  pOp = &p->aOp[addr];
  if( n>=0 || pOp->p4type ){
    vdbeChangeP4Full(p, pOp, zP4, n);
    return;
  }
  if( n==P4_INT32 ){
    /* Note: this cast is safe, because the origin data point was an int
    ** that was cast to a (const char *). */
    pOp->p4.i = SQLITE_PTR_TO_INT(zP4);
    pOp->p4type = P4_INT32;
  }else if( zP4!=0 ){
    assert( n<0 );
    pOp->p4.p = (void*)zP4;
    pOp->p4type = (signed char)n;
    if( n==P4_VTAB ) sqlite3VtabLock((VTable*)zP4);
  }
}